

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O1

int __thiscall
ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
e_budget(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
         *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = (t1->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[x];
  iVar1 = (t2->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  iVar3 = (((t1->super_Constants).tree_size_ + y) - (iVar4 + x + (t2->super_Constants).tree_size_))
          + iVar1;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar4 = iVar4 - iVar1;
  iVar1 = -iVar4;
  if (0 < iVar4) {
    iVar1 = iVar4;
  }
  iVar3 = (x - ((t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>
                ._M_impl.super__Vector_impl_data._M_start[x] + y)) +
          (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  iVar4 = -iVar3;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  return k - (iVar4 + iVar1 + iVar2);
}

Assistant:

int e_budget(const TreeIndex& t1, const TreeIndex& t2, const int x, const int y, const int k) const {
    // Lower bound formula (k - RA - L):
    // e(x,y) = k - |(|T1|-(x+1))-(|T2|-(y+1))| - |((x+1)-|T1_x|)-((y+1)-|T2_y|)|
    // New lower bound formula (k - R - A - L):
    // e(x,y) = k - |(|T1|-(x+1)-depth(x))-(|T2|-(y+1)-depth(y))| - |depth(x)-depth(y)| - |((x+1)-|T1_x|)-((y+1)-|T2_y|)|
    int x_size = t1.postl_to_size_[x];
    int y_size = t2.postl_to_size_[y];
    // int lower_bound = std::abs((t1_size_.back() - (x+1)) - (t2_size_.back() - (y+1))) +
    //                   std::abs(((x+1) - x_size) - ((y+1) - y_size));
    int lower_bound = std::abs((t1.tree_size_ - (x+1) - t1.postl_to_depth_[x]) -
        (t2.tree_size_ - (y+1) - t2.postl_to_depth_[y])) +
        std::abs(t1.postl_to_depth_[x] - t2.postl_to_depth_[y]) +
        std::abs(((x+1) - x_size) - ((y+1) - y_size));
    return (k - lower_bound); // TODO: Verify this -> BUG: There is a bug here possibly returning a negative number.
  }